

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O0

X509_VERIFY_PARAM * X509_VERIFY_PARAM_new(void)

{
  X509_VERIFY_PARAM *param;
  
  param = (X509_VERIFY_PARAM *)OPENSSL_zalloc(0x60);
  if (param == (X509_VERIFY_PARAM *)0x0) {
    param = (X509_VERIFY_PARAM *)0x0;
  }
  else {
    param->depth = -1;
  }
  return (X509_VERIFY_PARAM *)param;
}

Assistant:

X509_VERIFY_PARAM *X509_VERIFY_PARAM_new(void) {
  X509_VERIFY_PARAM *param = reinterpret_cast<X509_VERIFY_PARAM *>(
      OPENSSL_zalloc(sizeof(X509_VERIFY_PARAM)));
  if (!param) {
    return NULL;
  }
  param->depth = -1;
  return param;
}